

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pkware_encode.c
# Opt level: O1

zip_source_t *
zip_source_pkware_encode(zip_t *za,zip_source_t *src,zip_uint16_t em,int flags,char *password)

{
  zip_error_t *err;
  int iVar1;
  trad_pkware_conflict *ctx;
  char *pcVar2;
  zip_source_t *pzVar3;
  undefined6 in_register_00000012;
  zip_stat_t st;
  zip_stat_t local_68;
  
  if ((((int)CONCAT62(in_register_00000012,em) != 1) || (src == (zip_source_t *)0x0)) ||
     (password == (char *)0x0)) {
    iVar1 = 0x12;
LAB_0011115a:
    zip_error_set(&za->error,iVar1,0);
    return (zip_source_t *)0x0;
  }
  err = &za->error;
  if ((flags & 1U) == 0) {
    iVar1 = 0x18;
    goto LAB_0011115a;
  }
  ctx = (trad_pkware_conflict *)malloc(0x38);
  if (ctx == (trad_pkware_conflict *)0x0) {
    ctx = (trad_pkware_conflict *)0x0;
    zip_error_set(err,0xe,0);
  }
  else {
    pcVar2 = strdup(password);
    ctx->password = pcVar2;
    if (pcVar2 == (char *)0x0) {
      zip_error_set(err,0xe,0);
      free(ctx);
      ctx = (trad_pkware_conflict *)0x0;
    }
    else {
      ctx->buffer = (zip_buffer_t *)0x0;
      zip_error_init(&ctx->error);
    }
  }
  if (ctx == (trad_pkware_conflict *)0x0) {
    iVar1 = 0xe;
    goto LAB_0011115a;
  }
  iVar1 = zip_source_get_dos_time(src,&ctx->dostime);
  if (iVar1 < 1) {
    iVar1 = zip_source_stat(src,&local_68);
    if (iVar1 < 0) {
      zip_error_set_from_source(err,src);
      goto LAB_00111265;
    }
    if (((byte)local_68.valid & 0x10) == 0) {
      local_68.mtime = time((time_t *)0x0);
    }
    iVar1 = _zip_u2d_time(local_68.mtime,&ctx->dostime,err);
    if (iVar1 < 0) goto LAB_00111265;
  }
  pzVar3 = zip_source_layered(za,src,pkware_encrypt,ctx);
  if (pzVar3 != (zip_source_t *)0x0) {
    return pzVar3;
  }
LAB_00111265:
  trad_pkware_free(ctx);
  return (zip_source_t *)0x0;
}

Assistant:

zip_source_t *
zip_source_pkware_encode(zip_t *za, zip_source_t *src, zip_uint16_t em, int flags, const char *password) {
    struct trad_pkware *ctx;
    zip_source_t *s2;

    if (password == NULL || src == NULL || em != ZIP_EM_TRAD_PKWARE) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return NULL;
    }
    if (!(flags & ZIP_CODEC_ENCODE)) {
        zip_error_set(&za->error, ZIP_ER_ENCRNOTSUPP, 0);
        return NULL;
    }

    if ((ctx = trad_pkware_new(password, &za->error)) == NULL) {
        zip_error_set(&za->error, ZIP_ER_MEMORY, 0);
        return NULL;
    }

    if (zip_source_get_dos_time(src, &ctx->dostime) <= 0) {
        zip_stat_t st;

        if (zip_source_stat(src, &st) < 0) {
            zip_error_set_from_source(&za->error, src);
            trad_pkware_free(ctx);
            return NULL;
        }
        if (_zip_u2d_time((st.valid & ZIP_STAT_MTIME) ? st.mtime : time(NULL), &ctx->dostime, &za->error) < 0) {
            trad_pkware_free(ctx);
            return NULL;
        }
    }

    if ((s2 = zip_source_layered(za, src, pkware_encrypt, ctx)) == NULL) {
        trad_pkware_free(ctx);
        return NULL;
    }

    return s2;
}